

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_BlindTxOutUncompressedPubkeyTest_Test::TestBody
          (ConfidentialTransaction_BlindTxOutUncompressedPubkeyTest_Test *this)

{
  bool bVar1;
  char *message;
  undefined1 extraout_DL;
  AssertHelper local_378;
  Message local_370;
  int local_364;
  string local_360 [32];
  unsigned_long local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar;
  Message local_320 [2];
  Pubkey local_310;
  undefined1 local_2f8 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  pointer local_2d0;
  undefined1 local_2c8;
  ConfidentialValue local_2c0;
  BlindFactor local_298;
  BlindFactor local_278;
  ConfidentialAssetId local_258;
  undefined1 local_230 [8];
  BlindParameter param;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> blind_list;
  Pubkey pubkey2;
  Pubkey pubkey1;
  string local_150 [8];
  string pubkey2_hex;
  string local_128 [8];
  string pubkey1_hex;
  string local_100 [8];
  string inputassetblinder;
  string local_d8 [8];
  string inputasset;
  string local_b0 [8];
  string inputblinder;
  double inputamount;
  ConfidentialTransaction tx;
  allocator local_31;
  string local_30 [8];
  string tx_hex;
  ConfidentialTransaction_BlindTxOutUncompressedPubkeyTest_Test *this_local;
  
  tx_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "020000000001438cbb074e26715c25a11d12ef22f8e6080c466ff607936208473787138ba95a0000000000ffffffff0301f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001976a914dff13ae1f9b4ce176adbeef85db623a6ee5a907988ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000000f1b30001976a914de89a605e67cabd0391ecc8b01ba1ec9434394fe88ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000002710000000000000"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&inputamount,local_30);
  inputblinder.field_2._8_8_ = 0x3fb999999999999a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,"0000000000000000000000000000000000000000000000000000000000000000",
             (allocator *)(inputasset.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(inputasset.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d8,"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
             (allocator *)(inputassetblinder.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(inputassetblinder.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_100,"0000000000000000000000000000000000000000000000000000000000000000",
             (allocator *)(pubkey1_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(pubkey1_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_128,
             "04dada4cf7659309225a0a7cc34b7281fde98181a871ff9666ee7118895fe2a659d5f346c08488fb6a73a0d92ad1b547e58265b338fb2e73cea9ae6cd224225e22"
             ,(allocator *)(pubkey2_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(pubkey2_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,
             "04964523753907b96be824651f55eac8aead20f97759333813b3c0d9edc213e6abbce207ea330383fdccc5c78e9cd89f3eae8ed6089ddb7dd0878c7836e82e38bd"
             ,(allocator *)
              ((long)&pubkey1.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_128);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &blind_list.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_150);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             &param.value.version_);
  cfd::core::UnblindParameter::UnblindParameter((UnblindParameter *)local_230);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_258,local_d8);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)local_230,&local_258);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_258);
  cfd::core::BlindFactor::BlindFactor(&local_278,local_100);
  cfd::core::BlindFactor::operator=((BlindFactor *)&param.asset.version_,&local_278);
  cfd::core::BlindFactor::~BlindFactor(&local_278);
  cfd::core::BlindFactor::BlindFactor(&local_298,local_b0);
  cfd::core::BlindFactor::operator=
            ((BlindFactor *)
             ((long)&param.abf.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),&local_298);
  cfd::core::BlindFactor::~BlindFactor(&local_298);
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)cfd::core::Amount::CreateByCoinAmount((double)inputblinder.field_2._8_8_);
  local_2d0 = pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2c8 = extraout_DL;
  cfd::core::ConfidentialValue::ConfidentialValue(&local_2c0,(Amount *)&local_2d0);
  cfd::core::ConfidentialValue::operator=
            ((ConfidentialValue *)
             ((long)&param.vbf.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),&local_2c0);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_2c0);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::push_back
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             &param.value.version_,(value_type *)local_230);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_2f8);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_2f8,
             (value_type *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_2f8,
             (value_type *)
             &blind_list.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::Pubkey(&local_310);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_2f8,&local_310);
  cfd::core::Pubkey::~Pubkey(&local_310);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::BlindTxOut
                ((vector *)&inputamount,(vector *)&param.value.version_,(long)local_2f8,1,0,
                 (vector *)0x34);
    }
  }
  else {
    testing::Message::Message(local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x3c3,
               "Expected: (tx.BlindTxOut(blind_list, pubkeys)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_320);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  local_340 = std::__cxx11::string::length();
  local_364 = 0x4514;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_338,"tx.GetHex().length()","17684",&local_340,&local_364);
  std::__cxx11::string::~string(local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x3c5,message);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_2f8);
  cfd::core::UnblindParameter::~UnblindParameter((UnblindParameter *)local_230);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             &param.value.version_);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &blind_list.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&inputamount);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(ConfidentialTransaction, BlindTxOutUncompressedPubkeyTest) {
  std::string tx_hex = "020000000001438cbb074e26715c25a11d12ef22f8e6080c466ff607936208473787138ba95a0000000000ffffffff0301f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001976a914dff13ae1f9b4ce176adbeef85db623a6ee5a907988ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000000f1b30001976a914de89a605e67cabd0391ecc8b01ba1ec9434394fe88ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000002710000000000000";
  ConfidentialTransaction tx(tx_hex);
  double inputamount = 0.1;
  std::string inputblinder =
      "0000000000000000000000000000000000000000000000000000000000000000";
  std::string inputasset =
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3";
  std::string inputassetblinder =
      "0000000000000000000000000000000000000000000000000000000000000000";
  std::string pubkey1_hex =
      "04dada4cf7659309225a0a7cc34b7281fde98181a871ff9666ee7118895fe2a659d5f346c08488fb6a73a0d92ad1b547e58265b338fb2e73cea9ae6cd224225e22";
  std::string pubkey2_hex =
      "04964523753907b96be824651f55eac8aead20f97759333813b3c0d9edc213e6abbce207ea330383fdccc5c78e9cd89f3eae8ed6089ddb7dd0878c7836e82e38bd";
  Pubkey pubkey1(pubkey1_hex);
  Pubkey pubkey2(pubkey2_hex);

  std::vector<BlindParameter> blind_list;
  BlindParameter param;
  param.asset = ConfidentialAssetId(inputasset);
  param.abf = BlindFactor(inputassetblinder);
  param.vbf = BlindFactor(inputblinder);
  param.value = ConfidentialValue(Amount::CreateByCoinAmount(inputamount));
  blind_list.push_back(param);
  std::vector<Pubkey> pubkeys;
  pubkeys.push_back(pubkey1);
  pubkeys.push_back(pubkey2);
  pubkeys.push_back(Pubkey());

  EXPECT_NO_THROW((tx.BlindTxOut(blind_list, pubkeys)));
  // 乱数が混ざるため、サイズだけチェック
  EXPECT_EQ(tx.GetHex().length(), 17684);
}